

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result wabt::interp::Match(TableType *expected,TableType *actual,string *out_msg)

{
  Result RVar1;
  Enum EVar2;
  char *pcVar3;
  char *pcVar4;
  string sStack_38;
  
  if (*(int *)&(expected->super_ExternType).field_0xc ==
      *(int *)&(actual->super_ExternType).field_0xc) {
    RVar1 = Match(&expected->limits,&actual->limits,out_msg);
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  else {
    pcVar3 = GetName((ValueType)0x0);
    pcVar4 = GetName((ValueType)0x0);
    StringPrintf_abi_cxx11_
              (&sStack_38,"type mismatch in imported table, expected %s but got %s.",pcVar3,pcVar4);
    std::__cxx11::string::operator=((string *)out_msg,(string *)&sStack_38);
    std::__cxx11::string::_M_dispose();
    EVar2 = Error;
  }
  return (Result)EVar2;
}

Assistant:

Result Match(const TableType& expected,
             const TableType& actual,
             std::string* out_msg) {
  if (expected.element != actual.element) {
    *out_msg =
        StringPrintf("type mismatch in imported table, expected %s but got %s.",
                     GetName(expected.element), GetName(actual.element));
    return Result::Error;
  }

  if (Failed(Match(expected.limits, actual.limits, out_msg))) {
    return Result::Error;
  }

  return Result::Ok;
}